

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeStack.h
# Opt level: O3

LargeStackBlock<Js::StringCopyInfo> *
LargeStackBlock<Js::StringCopyInfo>::Make(ArenaAllocator *alloc,int itemCount)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  code *pcVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  bool bVar17;
  BOOL BVar18;
  LargeStackBlock<Js::StringCopyInfo> *pLVar19;
  undefined4 *puVar20;
  StringCopyInfo *pSVar21;
  bool *pbVar22;
  ulong uVar23;
  size_t requestedBytes;
  undefined4 uVar24;
  undefined4 uVar26;
  undefined1 auVar25 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 in_XMM1 [16];
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined8 extraout_XMM1_Qb_01;
  undefined1 auVar27 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar28 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar29 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar30 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar31 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar32 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar33 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  long lVar37;
  undefined1 auVar38 [16];
  long lVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar48 [16];
  
  pLVar19 = (LargeStackBlock<Js::StringCopyInfo> *)new<Memory::ArenaAllocator>(0x10,alloc,0x364470);
  pLVar19->itemCount = itemCount;
  if (itemCount == 0) {
    pSVar21 = (StringCopyInfo *)&DAT_00000008;
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)itemCount;
    requestedBytes = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0x18),8) == 0) {
      requestedBytes = SUB168(auVar2 * ZEXT816(0x18),0);
    }
    BVar18 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar18 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar20 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      in_XMM1._8_8_ = extraout_XMM1_Qb;
      in_XMM1._0_8_ = extraout_XMM1_Qa;
      *puVar20 = 1;
      bVar17 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                          ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                          "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar17) goto LAB_00d53f81;
      *puVar20 = 0;
    }
    if (requestedBytes == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar20 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      in_XMM1._8_8_ = extraout_XMM1_Qb_00;
      in_XMM1._0_8_ = extraout_XMM1_Qa_00;
      *puVar20 = 1;
      bVar17 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                          ,0x1fc,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)",
                          "byteSize != 0 || !TAllocator::FakeZeroLengthArray");
      if (!bVar17) goto LAB_00d53f81;
      *puVar20 = 0;
    }
    pSVar21 = (StringCopyInfo *)
              Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              AllocInternal(&alloc->
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                            ,requestedBytes);
    if (pSVar21 == (StringCopyInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar20 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      in_XMM1._8_8_ = extraout_XMM1_Qb_01;
      in_XMM1._0_8_ = extraout_XMM1_Qa_01;
      *puVar20 = 1;
      bVar17 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                          ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar17) {
LAB_00d53f81:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar20 = 0;
    }
    auVar2 = _DAT_00fa8550;
    uVar1 = (long)itemCount * 0x18 - 0x18;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar1;
    uVar24 = SUB164(auVar27 * ZEXT816(0xaaaaaaaaaaaaaaab),8);
    uVar26 = (undefined4)(uVar1 / 0x180000000);
    auVar28._0_8_ = CONCAT44(uVar26,uVar24);
    auVar28._8_4_ = uVar24;
    auVar28._12_4_ = uVar26;
    auVar25._0_8_ = auVar28._0_8_ >> 4;
    auVar25._8_8_ = auVar28._8_8_ >> 4;
    pbVar22 = &pSVar21->isInitialized;
    uVar23 = 0;
    auVar27 = pmovsxbq(in_XMM1,0xf0e);
    auVar28 = pmovsxbq(in_XMM2,0xd0c);
    auVar29 = pmovsxbq(in_XMM3,0xb0a);
    auVar30 = pmovsxbq(in_XMM4,0x908);
    auVar31 = pmovsxbq(in_XMM5,0x706);
    auVar32 = pmovsxbq(in_XMM6,0x504);
    auVar33 = pmovsxbq(in_XMM7,0x302);
    auVar34 = pmovsxbq(in_XMM8,0x100);
    do {
      auVar35._8_4_ = (int)uVar23;
      auVar35._0_8_ = uVar23;
      auVar35._12_4_ = (int)(uVar23 >> 0x20);
      auVar38 = auVar25 | auVar2;
      auVar40 = (auVar35 | auVar34) ^ auVar2;
      lVar37 = auVar38._0_8_;
      auVar41._0_8_ = -(ulong)(lVar37 < auVar40._0_8_);
      lVar39 = auVar38._8_8_;
      auVar41._8_8_ = -(ulong)(lVar39 < auVar40._8_8_);
      auVar48 = pshuflw(in_XMM14,auVar41,0xe8);
      auVar40._8_4_ = 0xffffffff;
      auVar40._0_8_ = 0xffffffffffffffff;
      auVar40._12_4_ = 0xffffffff;
      auVar40 = packssdw(auVar48 ^ auVar40,auVar48 ^ auVar40);
      if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *pbVar22 = false;
      }
      auVar41 = packssdw(auVar41,auVar41);
      auVar48._8_4_ = 0xffffffff;
      auVar48._0_8_ = 0xffffffffffffffff;
      auVar48._12_4_ = 0xffffffff;
      auVar41 = packssdw(auVar41 ^ auVar48,auVar41 ^ auVar48);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
        pbVar22[0x18] = false;
      }
      auVar41 = (auVar35 | auVar33) ^ auVar2;
      auVar42._0_8_ = -(ulong)(lVar37 < auVar41._0_8_);
      auVar42._8_8_ = -(ulong)(lVar39 < auVar41._8_8_);
      auVar40 = packssdw(auVar40,auVar42);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar40 = packssdw(auVar40 ^ auVar4,auVar40 ^ auVar4);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        pbVar22[0x30] = false;
      }
      auVar41 = pshufhw(auVar42,auVar42,0x84);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar41 = packssdw(auVar41 ^ auVar5,auVar41 ^ auVar5);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
        pbVar22[0x48] = false;
      }
      auVar41 = (auVar35 | auVar32) ^ auVar2;
      auVar43._0_8_ = -(ulong)(lVar37 < auVar41._0_8_);
      auVar43._8_8_ = -(ulong)(lVar39 < auVar41._8_8_);
      auVar40 = pshuflw(auVar40,auVar43,0xe8);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar40 = packssdw(auVar40 ^ auVar6,auVar40 ^ auVar6);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pbVar22[0x60] = false;
      }
      auVar41 = packssdw(auVar43,auVar43);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar41 = packssdw(auVar41 ^ auVar7,auVar41 ^ auVar7);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
        pbVar22[0x78] = false;
      }
      auVar41 = (auVar35 | auVar31) ^ auVar2;
      auVar44._0_8_ = -(ulong)(lVar37 < auVar41._0_8_);
      auVar44._8_8_ = -(ulong)(lVar39 < auVar41._8_8_);
      auVar40 = packssdw(auVar40,auVar44);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar40 = packssdw(auVar40 ^ auVar8,auVar40 ^ auVar8);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pbVar22[0x90] = false;
      }
      auVar41 = pshufhw(auVar44,auVar44,0x84);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar41 = packssdw(auVar41 ^ auVar9,auVar41 ^ auVar9);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
        pbVar22[0xa8] = false;
      }
      auVar41 = (auVar35 | auVar30) ^ auVar2;
      auVar45._0_8_ = -(ulong)(lVar37 < auVar41._0_8_);
      auVar45._8_8_ = -(ulong)(lVar39 < auVar41._8_8_);
      auVar40 = pshuflw(auVar40,auVar45,0xe8);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar40 = packssdw(auVar40 ^ auVar10,auVar40 ^ auVar10);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pbVar22[0xc0] = false;
      }
      auVar41 = packssdw(auVar45,auVar45);
      auVar11._8_4_ = 0xffffffff;
      auVar11._0_8_ = 0xffffffffffffffff;
      auVar11._12_4_ = 0xffffffff;
      auVar41 = packssdw(auVar41 ^ auVar11,auVar41 ^ auVar11);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
        pbVar22[0xd8] = false;
      }
      auVar41 = (auVar35 | auVar29) ^ auVar2;
      auVar46._0_8_ = -(ulong)(lVar37 < auVar41._0_8_);
      auVar46._8_8_ = -(ulong)(lVar39 < auVar41._8_8_);
      auVar40 = packssdw(auVar40,auVar46);
      auVar12._8_4_ = 0xffffffff;
      auVar12._0_8_ = 0xffffffffffffffff;
      auVar12._12_4_ = 0xffffffff;
      auVar40 = packssdw(auVar40 ^ auVar12,auVar40 ^ auVar12);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        pbVar22[0xf0] = false;
      }
      auVar41 = pshufhw(auVar46,auVar46,0x84);
      auVar13._8_4_ = 0xffffffff;
      auVar13._0_8_ = 0xffffffffffffffff;
      auVar13._12_4_ = 0xffffffff;
      auVar41 = packssdw(auVar41 ^ auVar13,auVar41 ^ auVar13);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
        pbVar22[0x108] = false;
      }
      auVar41 = (auVar35 | auVar28) ^ auVar2;
      auVar47._0_8_ = -(ulong)(lVar37 < auVar41._0_8_);
      auVar47._8_8_ = -(ulong)(lVar39 < auVar41._8_8_);
      auVar40 = pshuflw(auVar40,auVar47,0xe8);
      auVar14._8_4_ = 0xffffffff;
      auVar14._0_8_ = 0xffffffffffffffff;
      auVar14._12_4_ = 0xffffffff;
      auVar40 = packssdw(auVar40 ^ auVar14,auVar40 ^ auVar14);
      in_XMM14 = packsswb(auVar40,auVar40);
      if ((in_XMM14 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pbVar22[0x120] = false;
      }
      auVar40 = packssdw(auVar47,auVar47);
      auVar15._8_4_ = 0xffffffff;
      auVar15._0_8_ = 0xffffffffffffffff;
      auVar15._12_4_ = 0xffffffff;
      auVar40 = packssdw(auVar40 ^ auVar15,auVar40 ^ auVar15);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
        pbVar22[0x138] = false;
      }
      auVar40 = (auVar35 | auVar27) ^ auVar2;
      auVar36._0_8_ = -(ulong)(lVar37 < auVar40._0_8_);
      auVar36._8_8_ = -(ulong)(lVar39 < auVar40._8_8_);
      auVar40 = packssdw(auVar38,auVar36);
      auVar38._8_4_ = 0xffffffff;
      auVar38._0_8_ = 0xffffffffffffffff;
      auVar38._12_4_ = 0xffffffff;
      auVar40 = packssdw(auVar40 ^ auVar38,auVar40 ^ auVar38);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pbVar22[0x150] = false;
      }
      auVar40 = pshufhw(auVar36,auVar36,0x84);
      auVar16._8_4_ = 0xffffffff;
      auVar16._0_8_ = 0xffffffffffffffff;
      auVar16._12_4_ = 0xffffffff;
      auVar40 = packssdw(auVar40 ^ auVar16,auVar40 ^ auVar16);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
        pbVar22[0x168] = false;
      }
      uVar23 = uVar23 + 0x10;
      pbVar22 = pbVar22 + 0x180;
    } while ((uVar1 / 0x18 + 0x10 & 0xfffffffffffffff0) != uVar23);
  }
  pLVar19->items = pSVar21;
  pLVar19->index = 0;
  return pLVar19;
}

Assistant:

static LargeStackBlock<T>* Make(ArenaAllocator* alloc,int itemCount) {
        LargeStackBlock<T>* block = AnewStruct(alloc, LargeStackBlock<T>);
        block->itemCount=itemCount;
        block->items = AnewArray(alloc, T, itemCount);
        block->index=0;
        return block;
    }